

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O3

double task3(Matrix *A)

{
  long lVar1;
  long lVar2;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> ans;
  Matrix local_40;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_30;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  Matrix::Matrix(&local_40,A);
  EigQR(&local_30,&local_40,&it);
  Matrix::~Matrix(&local_40);
  lVar2 = std::chrono::_V2::system_clock::now();
  if (local_30.super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (double)((lVar2 - lVar1) / 1000000);
}

Assistant:

double task3(Matrix A)
{
    std::chrono::time_point<std::chrono::high_resolution_clock> start, end;

    start = std::chrono::high_resolution_clock::now();
    auto ans = EigQR(std::move(A));
    end = std::chrono::high_resolution_clock::now();

    return std::chrono::duration_cast<std::chrono::milliseconds>(end - start).count();
}